

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::WordTagger::WordTagger(WordTagger *this,WordTagger *from)

{
  void *pvVar1;
  string *psVar2;
  StringVector *this_00;
  StringVector *from_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__WordTagger_00708bb8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->language_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->language_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->language_,psVar2);
  }
  (this->tokensoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->tokensoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->tokensoutputfeaturename_,psVar2);
  }
  (this->tokentagsoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->tokentagsoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->tokentagsoutputfeaturename_,psVar2);
  }
  (this->tokenlocationsoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->tokenlocationsoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->tokenlocationsoutputfeaturename_,psVar2);
  }
  (this->tokenlengthsoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->tokenlengthsoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->tokenlengthsoutputfeaturename_,psVar2);
  }
  (this->modelparameterdata_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->modelparameterdata_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->modelparameterdata_,psVar2);
  }
  this->revision_ = from->revision_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 200) {
    this->_oneof_case_[0] = 200;
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->Tags_).stringtags_ = this_00;
    if (from->_oneof_case_[0] == 200) {
      from_00 = (from->Tags_).stringtags_;
    }
    else {
      from_00 = StringVector::default_instance();
    }
    StringVector::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

WordTagger::WordTagger(const WordTagger& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  language_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.language().size() > 0) {
    language_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.language_);
  }
  tokensoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.tokensoutputfeaturename().size() > 0) {
    tokensoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokensoutputfeaturename_);
  }
  tokentagsoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.tokentagsoutputfeaturename().size() > 0) {
    tokentagsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokentagsoutputfeaturename_);
  }
  tokenlocationsoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.tokenlocationsoutputfeaturename().size() > 0) {
    tokenlocationsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokenlocationsoutputfeaturename_);
  }
  tokenlengthsoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.tokenlengthsoutputfeaturename().size() > 0) {
    tokenlengthsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokenlengthsoutputfeaturename_);
  }
  modelparameterdata_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.modelparameterdata().size() > 0) {
    modelparameterdata_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.modelparameterdata_);
  }
  revision_ = from.revision_;
  clear_has_Tags();
  switch (from.Tags_case()) {
    case kStringTags: {
      mutable_stringtags()->::CoreML::Specification::StringVector::MergeFrom(from.stringtags());
      break;
    }
    case TAGS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.WordTagger)
}